

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O3

void __thiscall
MinVR::VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2>::VRDatumSpecialized
          (VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2> *this,float inVal)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  
  VRDatum::VRDatum(&this->super_VRDatum,VRCORETYPE_FLOAT);
  (this->super_VRDatum)._vptr_VRDatum = (_func_int **)&PTR__VRDatumSpecialized_00176b58;
  (this->value).super__List_base<float,_std::allocator<float>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->value;
  (this->value).super__List_base<float,_std::allocator<float>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->value;
  (this->value).super__List_base<float,_std::allocator<float>_>._M_impl._M_node._M_size = 0;
  this->needPush = false;
  this->pushed = false;
  this->stackFrame = 1;
  p_Var2 = (_List_node_base *)operator_new(0x18);
  *(float *)&p_Var2[1]._M_next = inVal;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(this->value).super__List_base<float,_std::allocator<float>_>._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

VRDatumSpecialized(const T inVal):
    VRDatum(TID), needPush(false), pushed(false), stackFrame(1) {
    value.push_front(inVal);
  }